

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getIntFromStmt(sqlite3 *db,char *zSql,int *piVal)

{
  sqlite3_stmt *pStmt_00;
  int iVar1;
  Mem *pMem;
  i64 iVar2;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_20;
  
  if (zSql != (char *)0x0) {
    local_20 = (sqlite3_stmt *)0x0;
    iVar1 = sqlite3LockAndPrepare(db,zSql,-1,0x80,(Vdbe *)0x0,&local_20,(char **)0x0);
    pStmt_00 = local_20;
    if (iVar1 == 0) {
      iVar1 = sqlite3_step(local_20);
      if (iVar1 == 100) {
        pMem = columnMem(pStmt_00,0);
        iVar2 = sqlite3VdbeIntValue(pMem);
        columnMallocFailure(pStmt_00);
        *piVal = (int)iVar2;
      }
      iVar1 = sqlite3_finalize(pStmt_00);
    }
    return iVar1;
  }
  return 7;
}

Assistant:

static int getIntFromStmt(sqlite3 *db, const char *zSql, int *piVal){
  int rc = SQLITE_NOMEM;
  if( zSql ){
    sqlite3_stmt *pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
    if( rc==SQLITE_OK ){
      if( SQLITE_ROW==sqlite3_step(pStmt) ){
        *piVal = sqlite3_column_int(pStmt, 0);
      }
      rc = sqlite3_finalize(pStmt);
    }
  }
  return rc;
}